

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

FirstMatchAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::FirstMatchAssertionExpr,slang::ast::AssertionExpr_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
          (BumpAllocator *this,AssertionExpr *args,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_1)

{
  pointer ppEVar1;
  size_type sVar2;
  FirstMatchAssertionExpr *pFVar3;
  
  pFVar3 = (FirstMatchAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FirstMatchAssertionExpr *)this->endPtr < pFVar3 + 1) {
    pFVar3 = (FirstMatchAssertionExpr *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pFVar3 + 1);
  }
  ppEVar1 = args_1->data_;
  sVar2 = args_1->size_;
  (pFVar3->super_AssertionExpr).kind = FirstMatch;
  (pFVar3->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pFVar3->seq = args;
  (pFVar3->matchItems).data_ = ppEVar1;
  (pFVar3->matchItems).size_ = sVar2;
  return pFVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }